

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

vector<sfc::Image,_std::allocator<sfc::Image>_> * __thiscall
sfc::Image::crops(vector<sfc::Image,_std::allocator<sfc::Image>_> *__return_storage_ptr__,
                 Image *this,uint tile_width,uint tile_height,Mode mode)

{
  Image local_b8;
  uint local_30;
  uint local_2c;
  uint y;
  uint x;
  uint local_20;
  Mode mode_local;
  uint tile_height_local;
  uint tile_width_local;
  Image *this_local;
  vector<sfc::Image,_std::allocator<sfc::Image>_> *v;
  
  y._3_1_ = 0;
  x = mode;
  local_20 = tile_height;
  mode_local = tile_width;
  _tile_height_local = this;
  this_local = (Image *)__return_storage_ptr__;
  std::vector<sfc::Image,_std::allocator<sfc::Image>_>::vector(__return_storage_ptr__);
  for (local_30 = 0; local_2c = 0, local_30 < this->_height; local_30 = local_20 + local_30) {
    for (; local_2c < this->_width; local_2c = mode_local + local_2c) {
      crop(&local_b8,this,local_2c,local_30,mode_local,local_20,x);
      std::vector<sfc::Image,_std::allocator<sfc::Image>_>::push_back
                (__return_storage_ptr__,&local_b8);
      ~Image(&local_b8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Image> Image::crops(unsigned tile_width, unsigned tile_height, Mode mode) const {
  std::vector<Image> v;
  unsigned x = 0;
  unsigned y = 0;
  while (y < _height) {
    while (x < _width) {
      v.push_back(crop(x, y, tile_width, tile_height, mode));
      x += tile_width;
    }
    x = 0;
    y += tile_height;
  }
  return v;
}